

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  num_writer f;
  char cVar5;
  int iVar6;
  int iVar7;
  _Alloc_hider _Var8;
  _Alloc_hider _Var9;
  uint uVar10;
  int iVar11;
  string_view prefix;
  string groups;
  string local_58;
  ulong local_38;
  int iStack_30;
  undefined4 uStack_2c;
  string *local_28;
  char cStack_20;
  undefined7 uStack_1f;
  
  grouping_impl<char>(&local_58,(locale_ref)(this->writer->locale_).locale_);
  if (local_58._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar5 = thousands_sep_impl<char>((locale_ref)(this->writer->locale_).locale_);
    if (cVar5 == '\0') {
      on_dec(this);
    }
    else {
      local_38 = this->abs_value;
      lVar3 = 0x3f;
      if ((local_38 | 1) != 0) {
        for (; (local_38 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar10 = ((uint)lVar3 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
      iVar6 = uVar10 + (*(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar10 * 8) <=
                       local_38);
      pcVar1 = local_58._M_dataplus._M_p + local_58._M_string_length;
      _Var9._M_p = local_58._M_dataplus._M_p;
      iVar7 = iVar6;
      iStack_30 = iVar6;
      if (local_58._M_string_length != 0) {
        iVar4 = (int)local_58._M_string_length;
        _Var8._M_p = local_58._M_dataplus._M_p;
        do {
          cVar2 = *_Var8._M_p;
          iVar11 = iVar7 - cVar2;
          _Var9._M_p = _Var8._M_p;
          iStack_30 = iVar6;
          if ((iVar11 == 0 || iVar7 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          iVar6 = iVar6 + 1;
          _Var8._M_p = _Var8._M_p + 1;
          local_58._M_string_length = local_58._M_string_length - 1;
          _Var9._M_p = pcVar1;
          iVar7 = iVar11;
          iStack_30 = iVar4 + uVar10 + (*(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                                  (ulong)uVar10 * 8) <= local_38);
        } while (local_58._M_string_length != 0);
      }
      if (_Var9._M_p == pcVar1) {
        iStack_30 = iStack_30 + (iVar7 + -1) / (int)pcVar1[-1];
      }
      f._12_4_ = uStack_2c;
      f.size = iStack_30;
      f._25_7_ = uStack_1f;
      f.sep = cVar5;
      f.abs_value = local_38;
      f.groups = &local_58;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      local_28 = &local_58;
      cStack_20 = cVar5;
      basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
      ::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                  *)this->writer,iStack_30,prefix,*this->specs,f);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }